

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

_Bool tcache_bin_info_settings_parse
                (char *bin_settings_segment_cur,size_t len_left,
                cache_bin_info_t *duckdb_je_tcache_bin_info,_Bool *bin_info_is_set)

{
  ulong uVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  size_t ncached_max;
  size_t size_end;
  size_t size_start;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  size_t local_40;
  char *local_38;
  
  local_40 = len_left;
  local_38 = bin_settings_segment_cur;
  do {
    _Var3 = duckdb_je_multi_setting_parse_next(&local_38,&local_40,&local_48,&local_50,&local_58);
    if (_Var3) {
      return _Var3;
    }
    if (0x800000 < local_50) {
      local_50 = 0x800000;
    }
    if (local_48 <= local_50 && local_48 < 0x800001) {
      uVar6 = 0;
      uVar7 = 0;
      if (8 < local_48) {
        uVar1 = local_48 * 2 - 1;
        lVar2 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar7 = (uint)lVar2;
        iVar4 = uVar7 - 6;
        if (uVar7 < 6) {
          iVar4 = 0;
        }
        bVar5 = 0x3c - ((byte)lVar2 ^ 0x3f);
        if (uVar7 < 7) {
          bVar5 = 4;
        }
        uVar7 = ((uint)(((local_48 - 1 >> (bVar5 & 0x3f)) << (bVar5 & 0x3f)) >> (bVar5 & 0x3f)) & 3)
                + iVar4 * 4 + 1;
      }
      if (8 < local_50) {
        uVar1 = local_50 * 2 - 1;
        lVar2 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar6 = (uint)lVar2;
        iVar4 = uVar6 - 6;
        if (uVar6 < 6) {
          iVar4 = 0;
        }
        bVar5 = 0x3c - ((byte)lVar2 ^ 0x3f);
        if (uVar6 < 7) {
          bVar5 = 4;
        }
        uVar6 = ((uint)(((local_50 - 1 >> (bVar5 & 0x3f)) << (bVar5 & 0x3f)) >> (bVar5 & 0x3f)) & 3)
                + iVar4 * 4 + 1;
      }
      if (0x1fff < local_58) {
        local_58 = 0x1fff;
      }
      for (; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
        duckdb_je_cache_bin_info_init(duckdb_je_tcache_bin_info + uVar7,(cache_bin_sz_t)local_58);
        if (bin_info_is_set != (_Bool *)0x0) {
          bin_info_is_set[uVar7] = true;
        }
      }
    }
  } while (local_40 != 0);
  return _Var3;
}

Assistant:

static bool
tcache_bin_info_settings_parse(const char *bin_settings_segment_cur,
    size_t len_left, cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX],
    bool bin_info_is_set[TCACHE_NBINS_MAX]) {
	do {
		size_t size_start, size_end;
		size_t ncached_max;
		bool err = multi_setting_parse_next(&bin_settings_segment_cur,
		    &len_left, &size_start, &size_end, &ncached_max);
		if (err) {
			return true;
		}
		if (size_end > TCACHE_MAXCLASS_LIMIT) {
			size_end = TCACHE_MAXCLASS_LIMIT;
		}
		if (size_start > TCACHE_MAXCLASS_LIMIT ||
		    size_start > size_end) {
			continue;
		}
		/* May get called before sz_init (during malloc_conf_init). */
		szind_t bin_start = sz_size2index_compute(size_start);
		szind_t bin_end = sz_size2index_compute(size_end);
		if (ncached_max > CACHE_BIN_NCACHED_MAX) {
			ncached_max = (size_t)CACHE_BIN_NCACHED_MAX;
		}
		for (szind_t i = bin_start; i <= bin_end; i++) {
			cache_bin_info_init(&tcache_bin_info[i],
			    (cache_bin_sz_t)ncached_max);
			if (bin_info_is_set != NULL) {
				bin_info_is_set[i] = true;
			}
		}
	} while (len_left > 0);

	return false;
}